

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

char * get_token_to_eol(char *buf,char *buf_end,char **token,size_t *token_len,int *ret)

{
  byte *pbVar1;
  char *token_start;
  int *ret_local;
  size_t *token_len_local;
  char **token_local;
  char *buf_end_local;
  char *buf_local;
  
  buf_end_local = buf;
  while (7 < (long)buf_end - (long)buf_end_local) {
    pbVar1 = (byte *)buf_end_local;
    if (((((byte)*buf_end_local - 0x20 < 0x5f) &&
         (pbVar1 = (byte *)(buf_end_local + 1), (byte)buf_end_local[1] - 0x20 < 0x5f)) &&
        (pbVar1 = (byte *)(buf_end_local + 2), (byte)buf_end_local[2] - 0x20 < 0x5f)) &&
       (((pbVar1 = (byte *)(buf_end_local + 3), (byte)buf_end_local[3] - 0x20 < 0x5f &&
         (pbVar1 = (byte *)(buf_end_local + 4), (byte)buf_end_local[4] - 0x20 < 0x5f)) &&
        ((pbVar1 = (byte *)(buf_end_local + 5), (byte)buf_end_local[5] - 0x20 < 0x5f &&
         ((pbVar1 = (byte *)(buf_end_local + 6), (byte)buf_end_local[6] - 0x20 < 0x5f &&
          (pbVar1 = (byte *)(buf_end_local + 7), (byte)buf_end_local[7] - 0x20 < 0x5f)))))))) {
      buf_end_local = buf_end_local + 8;
    }
    else {
      buf_end_local = (char *)pbVar1;
      if ((((byte)*buf_end_local < 0x20) && (*buf_end_local != '\t')) || (*buf_end_local == '\x7f'))
      goto LAB_0010d21a;
      buf_end_local = buf_end_local + 1;
    }
  }
  while( true ) {
    if (buf_end_local == buf_end) {
      *ret = -2;
      return (char *)0x0;
    }
    if ((0x5e < (byte)*buf_end_local - 0x20) &&
       ((((byte)*buf_end_local < 0x20 && (*buf_end_local != '\t')) || (*buf_end_local == '\x7f'))))
    break;
    buf_end_local = buf_end_local + 1;
  }
LAB_0010d21a:
  if (*buf_end_local == '\r') {
    if (buf_end_local + 1 == buf_end) {
      *ret = -2;
      return (char *)0x0;
    }
    if (buf_end_local[1] != '\n') {
      *ret = -1;
      return (char *)0x0;
    }
    *token_len = (long)buf_end_local - (long)buf;
    buf_end_local = buf_end_local + 2;
  }
  else {
    if (*buf_end_local != '\n') {
      *ret = -1;
      return (char *)0x0;
    }
    *token_len = (long)buf_end_local - (long)buf;
    buf_end_local = buf_end_local + 1;
  }
  *token = buf;
  return buf_end_local;
}

Assistant:

static const char *get_token_to_eol(const char *buf, const char *buf_end, const char **token, size_t *token_len, int *ret)
{
    const char *token_start = buf;

#ifdef __SSE4_2__
    static const char ALIGNED(16) ranges1[16] = "\0\010"    /* allow HT */
                                                "\012\037"  /* allow SP and up to but not including DEL */
                                                "\177\177"; /* allow chars w. MSB set */
    int found;
    buf = findchar_fast(buf, buf_end, ranges1, 6, &found);
    if (found)
        goto FOUND_CTL;
#else
    /* find non-printable char within the next 8 bytes, this is the hottest code; manually inlined */
    while (likely(buf_end - buf >= 8)) {
#define DOIT()                                                                                                                     \
    do {                                                                                                                           \
        if (unlikely(!IS_PRINTABLE_ASCII(*buf)))                                                                                   \
            goto NonPrintable;                                                                                                     \
        ++buf;                                                                                                                     \
    } while (0)
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
#undef DOIT
        continue;
    NonPrintable:
        if ((likely((unsigned char)*buf < '\040') && likely(*buf != '\011')) || unlikely(*buf == '\177')) {
            goto FOUND_CTL;
        }
        ++buf;
    }
#endif
    for (;; ++buf) {
        CHECK_EOF();
        if (unlikely(!IS_PRINTABLE_ASCII(*buf))) {
            if ((likely((unsigned char)*buf < '\040') && likely(*buf != '\011')) || unlikely(*buf == '\177')) {
                goto FOUND_CTL;
            }
        }
    }
FOUND_CTL:
    if (likely(*buf == '\015')) {
        ++buf;
        EXPECT_CHAR('\012');
        *token_len = buf - 2 - token_start;
    } else if (*buf == '\012') {
        *token_len = buf - token_start;
        ++buf;
    } else {
        *ret = -1;
        return NULL;
    }
    *token = token_start;

    return buf;
}